

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.h
# Opt level: O0

EditVertexTrait * MeshLib::trait<MeshLib::EditVertexTrait,MeshLib::Vertex>(Vertex *v)

{
  Trait **ppTVar1;
  bad_cast *this;
  EditVertexTrait *local_30;
  EditVertexTrait *t;
  Trait *pt;
  Vertex *v_local;
  
  ppTVar1 = Vertex::trait(v);
  t = (EditVertexTrait *)*ppTVar1;
  while( true ) {
    if (t == (EditVertexTrait *)0x0) {
      this = (bad_cast *)__cxa_allocate_exception(8);
      std::bad_cast::bad_cast(this);
      __cxa_throw(this,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    if (t == (EditVertexTrait *)0x0) {
      local_30 = (EditVertexTrait *)0x0;
    }
    else {
      local_30 = (EditVertexTrait *)__dynamic_cast(t,&Trait::typeinfo,&EditVertexTrait::typeinfo,0);
    }
    if (local_30 != (EditVertexTrait *)0x0) break;
    ppTVar1 = Trait::next((Trait *)t);
    t = (EditVertexTrait *)*ppTVar1;
  }
  return local_30;
}

Assistant:

T & trait( V * v )
{
	Trait * pt = v->trait();
	while( pt != NULL )
	{
		T *t = dynamic_cast<T*>(pt);
		if(t)
			return *t;
		//if( typeid(*pt) == typeid(T) )
		//	return *((T*)pt);
		pt = pt->next();
	}
	throw std::bad_cast();
	return *((T*)v->trait());
}